

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.h
# Opt level: O0

void __thiscall CECorrections::~CECorrections(CECorrections *this)

{
  undefined8 *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  *in_RDI = &PTR__CECorrections_0017b4d0;
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 9));
  std::__cxx11::string::~string((string *)(in_RDI + 5));
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

virtual ~CECorrections() {}